

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O1

void __thiscall FIX::FieldMap::addField(FieldMap *this,FieldBase *field)

{
  iterator __position;
  
  __position = findPositionFor(this,field->m_tag);
  if (__position._M_current != *(FieldBase **)(this + 0x10)) {
    std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::insert
              ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)(this + 8),
               (const_iterator)__position._M_current,field);
    return;
  }
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back
            ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)(this + 8),field);
  return;
}

Assistant:

void addField(const FieldBase &field) {
    Fields::iterator iter = findPositionFor(field.getTag());
    if (iter == m_fields.end()) {
      m_fields.push_back(field);
    } else {
      m_fields.insert(iter, field);
    }
  }